

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingThreadedTests.cpp
# Opt level: O2

void __thiscall deqp::egl::GLES2ThreadTest::ShaderCompile::exec(ShaderCompile *this,Thread *t)

{
  deUint32 err;
  Thread *pTVar1;
  MessageBuilder *this_00;
  undefined1 local_1b0 [400];
  
  pTVar1 = (Thread *)__dynamic_cast(t,&tcu::ThreadUtil::Thread::typeinfo,&EGLThread::typeinfo,0);
  if (pTVar1 != (Thread *)0x0) {
    local_1b0._0_8_ = pTVar1;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"Begin -- glCompileShader(");
    this_00 = tcu::ThreadUtil::MessageBuilder::operator<<
                        ((MessageBuilder *)local_1b0,&((this->m_shader).m_ptr)->shader);
    std::operator<<((ostream *)&this_00->field_0x18,")");
    tcu::ThreadUtil::MessageBuilder::operator<<(this_00,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    (**(code **)(*(long *)&pTVar1[1].super_Thread.m_attribs + 0x248))
              (((this->m_shader).m_ptr)->shader);
    err = (**(code **)(*(long *)&pTVar1[1].super_Thread.m_attribs + 0x800))();
    glu::checkError(err,"compileShader(m_shader->shader)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingThreadedTests.cpp"
                    ,0x5aa);
    local_1b0._0_8_ = pTVar1;
    std::__cxx11::stringstream::stringstream((stringstream *)(local_1b0 + 8));
    std::operator<<((ostream *)(local_1b0 + 0x18),"End -- glCompileShader()");
    tcu::ThreadUtil::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndToken *)&tcu::ThreadUtil::Message::End);
    std::__cxx11::stringstream::~stringstream((stringstream *)(local_1b0 + 8));
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void ShaderCompile::exec (tcu::ThreadUtil::Thread& t)
{
	EGLThread& thread = dynamic_cast<EGLThread&>(t);

	thread.newMessage() << "Begin -- glCompileShader(" << m_shader->shader << ")" << tcu::ThreadUtil::Message::End;
	GLU_CHECK_GLW_CALL(thread.gl, compileShader(m_shader->shader));
	thread.newMessage() << "End -- glCompileShader()" << tcu::ThreadUtil::Message::End;
}